

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O0

Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::Pipeline::load_abi_cxx11_
          (Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Pipeline *this,string_view s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Value *this_00;
  reference_wrapper *this_01;
  Mapping *root_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  undefined1 local_2b0 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Loader loader;
  Pipeline pipeline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  undefined1 local_128 [8];
  ExpectedRef<const_Mapping,_std::string> root_mapping_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  Pipeline *local_a8;
  size_t sStack_a0;
  undefined1 local_98 [8];
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  root;
  string_view s_local;
  
  sStack_a0 = s._M_len;
  local_a8 = this;
  root._112_8_ = this;
  yaml::parse_abi_cxx11_
            ((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98,(yaml *)this,s);
  bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_98);
  if (bVar1) {
    this_00 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_98);
    yaml::Value::getMapping_abi_cxx11_((ExpectedRef<const_Mapping,_std::string> *)local_128,this_00)
    ;
    bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_128);
    if (bVar1) {
      Pipeline((Pipeline *)
               &loader.indexes_.texture.
                super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_01 = (reference_wrapper *)
                Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_128);
      root_00 = std::reference_wrapper::operator_cast_to_Mapping_(this_01);
      Loader::Loader((Loader *)&result.has_value_,
                     (Pipeline *)
                     &loader.indexes_.texture.
                      super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,root_00);
      Loader::load_abi_cxx11_
                ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2b0,(Loader *)&result.has_value_);
      bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_2b0);
      if (bVar1) {
        Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,
                   (Pipeline *)
                   &loader.indexes_.texture.
                    super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        pbVar2 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2b0);
        std::operator+(&local_2f0,"Cannot load pipeline: ",pbVar2);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_2d0,&local_2f0);
        Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_2d0);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      root_mapping_result._36_4_ = 1;
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_2b0);
      Loader::~Loader((Loader *)&result.has_value_);
      ~Pipeline((Pipeline *)
                &loader.indexes_.texture.
                 super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"Root pipeline desc object is not a mapping",
                 (allocator<char> *)
                 ((long)&pipeline.commands.
                         super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_148,&local_168);
      Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_148);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&pipeline.commands.
                         super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      root_mapping_result._36_4_ = 1;
    }
    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_128);
  }
  else {
    pbVar2 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_98);
    std::operator+(&local_f8,"Cannot load pipeline: ",pbVar2);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_d8,&local_f8);
    Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_d8);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    root_mapping_result._36_4_ = 1;
  }
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_98);
  return __return_storage_ptr__;
}

Assistant:

Expected<Pipeline, std::string> Pipeline::load(std::string_view s) {
	const auto root = yaml::parse(s);
	if (!root)
		return Unexpected("Cannot load pipeline: " + root.error());

	auto root_mapping_result = root.value().getMapping();
	if (!root_mapping_result)
		return Unexpected<std::string>("Root pipeline desc object is not a mapping");

	Pipeline pipeline;
	Loader loader(pipeline, root_mapping_result.value());
	const auto result = loader.load();
	if (!result)
		return Unexpected("Cannot load pipeline: " + result.error());

	return pipeline;
}